

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong __pos;
  double dVar7;
  size_t oindex;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *index = 0;
  dVar7 = getNumberBlock(ustring,index);
  if (NAN(dVar7)) {
    *index = 0;
  }
  else {
    __pos = *index;
    while (__pos < ustring->_M_string_length) {
      pcVar2 = (ustring->_M_dataplus)._M_p;
      bVar1 = pcVar2[__pos];
      uVar4 = (ulong)bVar1;
      if (uVar4 < 0x30) {
        if ((0x840000000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_00359c17;
        if (uVar4 != 0x28) {
          if ((0x680000000000U >> (uVar4 & 0x3f) & 1) != 0) {
            *index = 0;
            return NAN;
          }
          goto LAB_00359c0e;
        }
        oindex = 0;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,
                   __pos,0xffffffffffffffff);
        local_58 = getNumberBlock((string *)&local_50,&oindex);
        std::__cxx11::string::~string((string *)&local_50);
        if (NAN(local_58)) {
          return dVar7;
        }
        dVar7 = dVar7 * local_58;
        sVar6 = oindex;
        sVar5 = *index;
      }
      else {
LAB_00359c0e:
        if (bVar1 != 0x78) {
          return dVar7;
        }
LAB_00359c17:
        sVar6 = __pos + 1;
        bVar3 = looksLikeNumber(ustring,sVar6);
        if ((!bVar3) && (pcVar2[sVar6] != '(')) {
          return dVar7;
        }
        oindex = 0;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,
                   sVar6,0xffffffffffffffff);
        local_58 = getNumberBlock((string *)&local_50,&oindex);
        std::__cxx11::string::~string((string *)&local_50);
        if (NAN(local_58)) {
          return dVar7;
        }
        sVar6 = *index;
        sVar5 = oindex;
        if ((ustring->_M_dataplus)._M_p[sVar6] == '/') {
          dVar7 = dVar7 / local_58;
        }
        else {
          dVar7 = dVar7 * local_58;
        }
      }
      __pos = sVar6 + sVar5 + 1;
      *index = __pos;
    }
  }
  return dVar7;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}